

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O2

void __thiscall cmDebugServerJson::OnChangeState(cmDebugServerJson *this)

{
  string local_30;
  
  StatusString_abi_cxx11_(&local_30,this);
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmDebugServerJson::OnChangeState()
{
  AsyncBroadcast(StatusString());
}